

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::predictMultiple(IMLE *this,Z *z)

{
  double dVar1;
  bool bVar2;
  int worseSol;
  int newSol2;
  int newSol1;
  int local_2c;
  int local_28;
  int local_24;
  
  predict(this,z);
  dVar1 = *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    bVar2 = validForwardSolutions(this,&local_24,&local_28,&local_2c);
    if (!bVar2) {
      do {
        this->nSolFound = this->nSolFound + 1;
        clusterForwardSolutions(this,local_24,local_28,local_2c);
        bVar2 = validForwardSolutions(this,&local_24,&local_28,&local_2c);
      } while (!bVar2);
      getForwardSolutions(this);
    }
  }
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictMultiple(Z const &z)
{
    predict(z);

    if( sum_p_z(0) == 0.0 )
        return;

    int newSol1, newSol2, worseSol;
    if( !validForwardSolutions(newSol1, newSol2, worseSol) )
    {

        do
        {
            nSolFound++;
            clusterForwardSolutions(newSol1, newSol2, worseSol);
        } while ( !validForwardSolutions(newSol1, newSol2, worseSol) );

        getForwardSolutions();
    }

    //          Not needed, already in predict()
    // hasPredJacobian = false;
    // hasPredErrorReductionDrvt = false;
}